

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O3

int ecx_readPDOassignCA(ecx_contextt *context,uint16 Slave,uint16 PDOassign)

{
  uint16 index;
  ec_PDOassignt *p;
  ec_PDOdesct *p_00;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  int rdl;
  
  p = context->PDOassign;
  p->n = '\0';
  iVar1 = ecx_SDOread(context,Slave,PDOassign,'\0','\x01',&rdl,p,700000);
  iVar6 = 0;
  if ((0 < iVar1) && (uVar4 = (ulong)context->PDOassign->n, iVar6 = 0, uVar4 != 0)) {
    iVar6 = 0;
    uVar5 = 1;
    do {
      index = context->PDOassign->index[uVar5 - 1];
      if (index != 0) {
        p_00 = context->PDOdesc;
        p_00->n = '\0';
        ecx_SDOread(context,Slave,index,'\0','\x01',&rdl,p_00,700000);
        uVar2 = (ulong)context->PDOdesc->n;
        if (uVar2 != 0) {
          uVar3 = 0;
          do {
            iVar6 = iVar6 + (uint)(byte)context->PDOdesc->PDO[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
      }
      bVar7 = uVar5 != uVar4;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  return iVar6;
}

Assistant:

int ecx_readPDOassignCA(ecx_contextt *context, uint16 Slave, uint16 PDOassign)
{
   uint16 idxloop, nidx, subidxloop, idx, subidx;
   int wkc, bsize = 0, rdl;

   /* find maximum size of PDOassign buffer */
   rdl = sizeof(ec_PDOassignt); 
   context->PDOassign->n=0;
   /* read rxPDOassign in CA mode, all subindexes are read in one struct */
   wkc = ecx_SDOread(context, Slave, PDOassign, 0x00, TRUE, &rdl, context->PDOassign, EC_TIMEOUTRXM);
   /* positive result from slave ? */
   if ((wkc > 0) && (context->PDOassign->n > 0))
   {
      nidx = context->PDOassign->n;
      bsize = 0;
      /* for each PDO do */
      for (idxloop = 1; idxloop <= nidx; idxloop++)
      {
         /* get index from PDOassign struct */
         idx = etohs(context->PDOassign->index[idxloop - 1]);
         if (idx > 0)
         {
            rdl = sizeof(ec_PDOdesct); context->PDOdesc->n = 0;
            /* read SDO's that are mapped in PDO, CA mode */
            wkc = ecx_SDOread(context, Slave,idx, 0x00, TRUE, &rdl, context->PDOdesc, EC_TIMEOUTRXM);
            subidx = context->PDOdesc->n;
            /* extract all bitlengths of SDO's */
            for (subidxloop = 1; subidxloop <= subidx; subidxloop++)
            {
               bsize += LO_BYTE(etohl(context->PDOdesc->PDO[subidxloop -1]));
            }
         }
      }
   }

   /* return total found bitlength (PDO) */
   return bsize;
}